

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Textures.cpp
# Opt level: O0

SP __thiscall pbrt::SemanticParser::createTexture_constant(SemanticParser *this,SP *in)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  string *in_RDI;
  float v;
  SP SVar4;
  SP tex;
  ParamSet *in_stack_fffffffffffffee8;
  vec3f *in_stack_fffffffffffffef0;
  string *this_00;
  allocator local_b1;
  string local_b0 [39];
  allocator local_89;
  string local_88 [20];
  float in_stack_ffffffffffffff8c;
  string *in_stack_ffffffffffffff90;
  ParamSet *in_stack_ffffffffffffff98;
  float local_60;
  allocator local_49;
  string local_48 [16];
  string *in_stack_ffffffffffffffc8;
  float *in_stack_ffffffffffffffd0;
  ParamSet *in_stack_ffffffffffffffd8;
  
  this_00 = in_RDI;
  std::make_shared<pbrt::ConstantTexture>();
  std::__shared_ptr_access<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1f5118);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"value",&local_49);
  bVar1 = syntactic::ParamSet::hasParam1f((ParamSet *)this_00,in_RDI);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  if (bVar1) {
    std::__shared_ptr_access<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1f5197);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,"value",&local_89);
    v = syntactic::ParamSet::getParam1f
                  (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    math::vec3f::vec3f((vec3f *)&stack0xffffffffffffff98,v);
    peVar3 = std::
             __shared_ptr_access<pbrt::ConstantTexture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<pbrt::ConstantTexture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1f520c);
    *(ParamSet **)&peVar3->value = in_stack_ffffffffffffff98;
    (peVar3->value).z = local_60;
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
  }
  else {
    peVar2 = std::
             __shared_ptr_access<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1f52dd);
    in_stack_fffffffffffffee8 = &peVar2->super_ParamSet;
    peVar3 = std::
             __shared_ptr_access<pbrt::ConstantTexture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<pbrt::ConstantTexture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1f52f2);
    in_stack_fffffffffffffef0 = &peVar3->value;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"value",&local_b1);
    syntactic::ParamSet::getParam3f
              (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  }
  std::shared_ptr<pbrt::Texture>::shared_ptr<pbrt::ConstantTexture,void>
            ((shared_ptr<pbrt::Texture> *)in_stack_fffffffffffffef0,
             (shared_ptr<pbrt::ConstantTexture> *)in_stack_fffffffffffffee8);
  std::shared_ptr<pbrt::ConstantTexture>::~shared_ptr((shared_ptr<pbrt::ConstantTexture> *)0x1f53ac)
  ;
  SVar4.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  SVar4.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this_00;
  return (SP)SVar4.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Texture::SP SemanticParser::createTexture_constant(pbrt::syntactic::Texture::SP in)
  {
    ConstantTexture::SP tex = std::make_shared<ConstantTexture>();
    if (in->hasParam1f("value"))
      tex->value = vec3f(in->getParam1f("value"));
    else
      in->getParam3f(&tex->value.x,"value");
    return tex;
  }